

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_from_part(REF_INTERP ref_interp,REF_INT *to_part)

{
  REF_CELL *ref_cell_ptr;
  int iVar1;
  REF_MPI pRVar2;
  REF_NODE ref_node;
  REF_NODE ref_node_00;
  REF_GLOB *pRVar3;
  REF_DBL *pRVar4;
  bool bVar5;
  REF_INT RVar6;
  uint uVar7;
  REF_INT *pRVar8;
  REF_DBL *pRVar9;
  REF_GLOB *pRVar10;
  void *pvVar11;
  long lVar12;
  ulong uVar13;
  undefined8 uVar14;
  size_t sVar15;
  long lVar16;
  char *pcVar17;
  int iVar18;
  long lVar19;
  uint unaff_R13D;
  long lVar20;
  REF_CELL *ref_cell_ptr_00;
  REF_INT local_19c;
  REF_INT n_donor;
  REF_INT n_recept;
  REF_MPI local_190;
  REF_CELL local_188;
  REF_INT n_find;
  REF_INT *local_178;
  REF_INT *local_170;
  REF_INT *recept_part;
  REF_INT *local_160;
  REF_GRID local_158;
  REF_INT *donor_cell;
  REF_INT *donor_ret;
  REF_DBL *recept_bary;
  REF_GLOB *recept_global;
  REF_INT n_lookedup;
  long local_128;
  REF_INT *recept_cell;
  void *local_118;
  void *local_110;
  void *local_108;
  void *local_100;
  REF_INT *find_ret;
  REF_INT cell_node;
  REF_INT *local_e8;
  REF_INT *lookedup_cell;
  REF_INT *lookedup_donation;
  REF_GLOB *find_nodes;
  REF_INT *find_donation;
  REF_DBL *donor_bary;
  REF_GLOB *donor_global;
  REF_GRID local_b0;
  REF_INT nodes [27];
  
  pRVar2 = ref_interp->ref_mpi;
  local_158 = ref_interp->from_grid;
  local_b0 = ref_interp->to_grid;
  ref_node = local_b0->node;
  ref_node_00 = local_158->node;
  local_188 = (&ref_interp->from_tet)[local_158->twod != 0];
  if (ref_interp->max < ref_node->max) {
    unaff_R13D = ref_interp_resize(ref_interp,ref_node->max);
    if (unaff_R13D != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0xad3,"ref_interp_from_part",(ulong)unaff_R13D,"resize");
      return unaff_R13D;
    }
  }
  local_e8 = to_part;
  if ((long)ref_node_00->max < 0) {
    unaff_R13D = 1;
LAB_001855fc:
    bVar5 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xad6,
           "ref_interp_from_part");
    pRVar8 = (REF_INT *)0x0;
  }
  else {
    pRVar8 = (REF_INT *)malloc((long)ref_node_00->max << 2);
    if (pRVar8 == (REF_INT *)0x0) {
      unaff_R13D = 2;
      goto LAB_001855fc;
    }
    bVar5 = true;
    if (0 < ref_node_00->max) {
      lVar12 = 0;
      do {
        pRVar8[lVar12] = -1;
        lVar12 = lVar12 + 1;
      } while (lVar12 < ref_node_00->max);
    }
  }
  if (!bVar5) {
    return unaff_R13D;
  }
  iVar18 = 0;
  n_recept = 0;
  local_19c = 0;
  if (0 < (long)ref_node->max) {
    lVar12 = 0;
    do {
      if (((-1 < ref_node->global[lVar12]) && (ref_node->ref_mpi->id == ref_node->part[lVar12])) &&
         (ref_interp->cell[lVar12] != -1)) {
        iVar18 = iVar18 + 1;
        n_recept = iVar18;
      }
      lVar12 = lVar12 + 1;
      local_19c = (REF_INT)lVar12;
    } while (ref_node->max != lVar12);
  }
  lVar12 = (long)n_recept;
  if (lVar12 < 0) {
    pcVar17 = "malloc recept_bary of REF_DBL negative";
    uVar14 = 0xadf;
    goto LAB_00185987;
  }
  local_190 = pRVar2;
  local_178 = pRVar8;
  pRVar9 = (REF_DBL *)malloc((ulong)(uint)(n_recept * 4) << 3);
  recept_bary = pRVar9;
  if (pRVar9 == (REF_DBL *)0x0) {
    pcVar17 = "malloc recept_bary of REF_DBL NULL";
    uVar14 = 0xadf;
  }
  else {
    sVar15 = lVar12 * 4;
    local_170 = (REF_INT *)malloc(sVar15);
    recept_cell = local_170;
    if (local_170 == (REF_INT *)0x0) {
      pcVar17 = "malloc recept_cell of REF_INT NULL";
      uVar14 = 0xae0;
    }
    else {
      pRVar10 = (REF_GLOB *)malloc(lVar12 << 3);
      recept_global = pRVar10;
      if (pRVar10 == (REF_GLOB *)0x0) {
        pcVar17 = "malloc recept_global of REF_GLOB NULL";
        uVar14 = 0xae1;
      }
      else {
        local_100 = malloc(sVar15);
        if (local_100 == (void *)0x0) {
          pcVar17 = "malloc recept_ret of REF_INT NULL";
          uVar14 = 0xae2;
        }
        else {
          recept_part = (REF_INT *)malloc(sVar15);
          pRVar2 = local_190;
          if (recept_part == (REF_INT *)0x0) {
            pcVar17 = "malloc recept_part of REF_INT NULL";
            uVar14 = 0xae3;
          }
          else {
            iVar18 = 0;
            n_recept = 0;
            local_19c = 0;
            if (0 < ref_node->max) {
              pRVar3 = ref_node->global;
              lVar12 = 0;
              lVar16 = 0;
              do {
                lVar19 = pRVar3[lVar16];
                if (((-1 < lVar19) && (ref_node->ref_mpi->id == ref_node->part[lVar16])) &&
                   (pRVar8 = ref_interp->cell, pRVar8[lVar16] != -1)) {
                  pRVar4 = ref_interp->bary;
                  lVar20 = 0;
                  do {
                    pRVar9[iVar18 * 4 + lVar20] = *(REF_DBL *)((long)pRVar4 + lVar20 * 8 + lVar12);
                    lVar20 = lVar20 + 1;
                  } while (lVar20 != 4);
                  lVar20 = (long)iVar18;
                  local_170[lVar20] = pRVar8[lVar16];
                  if (ref_node->max <= lVar16) {
                    lVar19 = -1;
                  }
                  pRVar10[lVar20] = lVar19;
                  recept_part[lVar20] = ref_interp->part[lVar16];
                  *(REF_INT *)((long)local_100 + lVar20 * 4) = local_e8[lVar16];
                  iVar18 = iVar18 + 1;
                  n_recept = iVar18;
                }
                lVar16 = lVar16 + 1;
                local_19c = (REF_INT)lVar16;
                lVar12 = lVar12 + 0x20;
              } while (lVar16 < ref_node->max);
            }
            uVar7 = ref_mpi_blindsend(local_190,recept_part,local_170,1,n_recept,&donor_cell,
                                      &n_donor,1);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0xaf5,"ref_interp_from_part",(ulong)uVar7,"blind send cell");
              return uVar7;
            }
            uVar7 = ref_mpi_blindsend(pRVar2,recept_part,local_100,1,n_recept,&donor_ret,&n_donor,1)
            ;
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0xaf8,"ref_interp_from_part",(ulong)uVar7,"blind send ret");
              return uVar7;
            }
            uVar7 = ref_mpi_blindsend(pRVar2,recept_part,recept_global,1,n_recept,&donor_global,
                                      &n_donor,2);
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0xafc,"ref_interp_from_part",(ulong)uVar7,"blind send global");
              return uVar7;
            }
            uVar7 = ref_mpi_blindsend(pRVar2,recept_part,recept_bary,4,n_recept,&donor_bary,&n_donor
                                      ,3);
            RVar6 = n_donor;
            if (uVar7 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0xaff,"ref_interp_from_part",(ulong)uVar7,"blind send bary");
              return uVar7;
            }
            if (n_donor < 0) {
              bVar5 = false;
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0xb01,"ref_interp_from_part","malloc donor_nodes of REF_GLOB negative");
              unaff_R13D = 1;
            }
            else {
              uVar7 = n_donor * 4;
              pRVar8 = (REF_INT *)malloc((ulong)uVar7 * 8);
              if (pRVar8 == (REF_INT *)0x0) {
                bVar5 = false;
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0xb01,"ref_interp_from_part","malloc donor_nodes of REF_GLOB NULL");
                unaff_R13D = 2;
                local_170 = (REF_INT *)0x0;
              }
              else {
                bVar5 = true;
                local_170 = pRVar8;
                if (RVar6 != 0) {
                  uVar13 = 1;
                  if (1 < (int)uVar7) {
                    uVar13 = (ulong)uVar7;
                  }
                  memset(pRVar8,0xff,uVar13 << 3);
                }
              }
            }
            if (!bVar5) {
              return unaff_R13D;
            }
            if ((long)n_donor < 0) {
              pcVar17 = "malloc donor_donation of REF_INT negative";
              uVar14 = 0xb02;
LAB_00185987:
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,uVar14,"ref_interp_from_part",pcVar17);
              return 1;
            }
            sVar15 = (long)n_donor << 2;
            pvVar11 = malloc(sVar15);
            if (pvVar11 == (void *)0x0) {
              pcVar17 = "malloc donor_donation of REF_INT NULL";
              uVar14 = 0xb02;
            }
            else {
              local_108 = pvVar11;
              local_160 = (REF_INT *)malloc(sVar15);
              if (local_160 == (REF_INT *)0x0) {
                pcVar17 = "malloc donor_part of REF_INT NULL";
                uVar14 = 0xb03;
              }
              else {
                local_110 = malloc(sVar15);
                if (local_110 == (void *)0x0) {
                  pcVar17 = "malloc donor_origpart of REF_INT NULL";
                  uVar14 = 0xb04;
                }
                else {
                  if (0 < n_donor) {
                    lVar12 = 0;
                    do {
                      uVar7 = ref_cell_nodes(local_188,donor_cell[lVar12],nodes);
                      if (uVar7 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0xb08,"ref_interp_from_part",(ulong)uVar7,
                               "node needs to be localized");
                        return uVar7;
                      }
                      if (0 < local_188->node_per) {
                        lVar16 = 0;
                        do {
                          local_178[nodes[lVar16]] = donor_ret[lVar12];
                          lVar16 = lVar16 + 1;
                        } while (lVar16 < local_188->node_per);
                      }
                      lVar12 = lVar12 + 1;
                    } while (lVar12 < n_donor);
                  }
                  uVar7 = ref_node_ghost_int(ref_node_00,local_178,1);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0xb0d,"ref_interp_from_part",(ulong)uVar7,"ghost from_part");
                    return uVar7;
                  }
                  uVar7 = ref_interp_fill_empty_from_part(ref_interp,local_178);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0xb10,"ref_interp_from_part",(ulong)uVar7,"fill part");
                    return uVar7;
                  }
                  if (0 < n_donor) {
                    lVar12 = 0;
                    do {
                      uVar7 = ref_cell_nodes(local_188,donor_cell[lVar12],nodes);
                      if (uVar7 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0xb16,"ref_interp_from_part",(ulong)uVar7,
                               "node needs to be localized");
                        return uVar7;
                      }
                      iVar18 = local_188->node_per;
                      if (0 < (long)iVar18) {
                        lVar16 = 0;
                        do {
                          iVar1 = nodes[lVar16];
                          lVar19 = -1;
                          if (((-1 < (long)iVar1) && (iVar1 < ref_node_00->max)) &&
                             (lVar19 = ref_node_00->global[iVar1], lVar19 < 0)) {
                            lVar19 = -1;
                          }
                          *(long *)(local_170 + (ulong)((uint)lVar12 & 0x3fffffff) * 8 + lVar16 * 2)
                               = lVar19;
                          lVar16 = lVar16 + 1;
                        } while (iVar18 != lVar16);
                      }
                      *(uint *)((long)local_108 + lVar12 * 4) = (uint)lVar12;
                      uVar7 = ref_cell_part_cell_node
                                        (local_188,ref_node_00,donor_cell[lVar12],&cell_node);
                      if (uVar7 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0xb1d,"ref_interp_from_part",(ulong)uVar7,"part cell_node");
                        return uVar7;
                      }
                      local_160[lVar12] = local_178[nodes[cell_node]];
                      *(REF_INT *)((long)local_110 + lVar12 * 4) = local_190->id;
                      lVar12 = lVar12 + 1;
                    } while (lVar12 < n_donor);
                  }
                  if (0 < ref_node_00->max) {
                    lVar12 = 0;
                    do {
                      if ((-1 < ref_node_00->global[lVar12]) && (local_178[lVar12] == -1)) {
                        local_19c = (REF_INT)lVar12;
                        pcVar17 = "from_part not set for node";
                        uVar14 = 0xb24;
                        goto LAB_00185987;
                      }
                      lVar12 = lVar12 + 1;
                    } while (lVar12 < ref_node_00->max);
                  }
                  local_19c = 0;
                  if (0 < ref_node_00->max) {
                    pRVar8 = ref_node_00->part;
                    do {
                      pRVar8[local_19c] = local_178[local_19c];
                      local_19c = local_19c + 1;
                    } while (local_19c < ref_node_00->max);
                  }
                  uVar7 = ref_migrate_shufflin(local_158);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0xb2c,"ref_interp_from_part",(ulong)uVar7,"shufflin from grid");
                    return uVar7;
                  }
                  if (ref_interp->from_cell_freeable != 0) {
                    ref_cell_ptr_00 = &ref_interp->from_tri;
                    ref_cell_ptr = &ref_interp->from_tet;
                    ref_cell_free(*ref_cell_ptr_00);
                    ref_cell_free(*ref_cell_ptr);
                    uVar7 = ref_shard_extract_tri(local_158,ref_cell_ptr_00);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0xb32,"ref_interp_from_part",(ulong)uVar7,"shard tri");
                      return uVar7;
                    }
                    uVar7 = ref_shard_extract_tet(local_158,ref_cell_ptr);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0xb34,"ref_interp_from_part",(ulong)uVar7,"shard tet");
                      return uVar7;
                    }
                    if (local_158->twod == 0) {
                      ref_cell_ptr_00 = ref_cell_ptr;
                    }
                    local_188 = *ref_cell_ptr_00;
                  }
                  uVar7 = ref_mpi_blindsend(local_190,local_160,local_170,4,n_donor,&find_nodes,
                                            &n_find,2);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0xb40,"ref_interp_from_part",(ulong)uVar7,"blind send cell");
                    return uVar7;
                  }
                  uVar7 = ref_mpi_blindsend(local_190,local_160,local_108,1,n_donor,&find_donation,
                                            &n_find,1);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0xb43,"ref_interp_from_part",(ulong)uVar7,"blind send cell");
                    return uVar7;
                  }
                  uVar7 = ref_mpi_blindsend(local_190,local_160,local_110,1,n_donor,&find_ret,
                                            &n_find,1);
                  if (uVar7 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0xb46,"ref_interp_from_part",(ulong)uVar7,"blind send cell");
                    return uVar7;
                  }
                  if ((long)n_find < 0) {
                    pcVar17 = "malloc find_cell of REF_INT negative";
                    uVar14 = 0xb48;
                    goto LAB_00185987;
                  }
                  local_118 = malloc((long)n_find << 2);
                  if (local_118 != (void *)0x0) {
                    if (0 < n_find) {
                      local_128 = 0;
                      do {
                        if (0 < local_188->node_per) {
                          local_158 = (REF_GRID)((ulong)((uint)local_128 & 0x3fffffff) << 5);
                          pRVar8 = nodes;
                          lVar12 = 0;
                          do {
                            uVar7 = ref_node_local(ref_node_00,
                                                   *(REF_GLOB *)
                                                    ((long)find_nodes + (long)local_158 + lVar12 * 8
                                                    ),pRVar8);
                            if (uVar7 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                     ,0xb4d,"ref_interp_from_part",(ulong)uVar7,"g2l");
                              return uVar7;
                            }
                            lVar12 = lVar12 + 1;
                            pRVar8 = pRVar8 + 1;
                          } while (lVar12 < local_188->node_per);
                        }
                        uVar7 = ref_cell_with(local_188,nodes,
                                              (REF_INT *)((long)local_118 + local_128 * 4));
                        if (uVar7 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0xb50,"ref_interp_from_part",(ulong)uVar7,"find cell with nodes");
                          return uVar7;
                        }
                        local_128 = local_128 + 1;
                      } while (local_128 < n_find);
                    }
                    uVar7 = ref_mpi_blindsend(local_190,find_ret,local_118,1,n_find,&lookedup_cell,
                                              &n_lookedup,1);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0xb55,"ref_interp_from_part",(ulong)uVar7,"blind send cell");
                      return uVar7;
                    }
                    uVar7 = ref_mpi_blindsend(local_190,find_ret,find_donation,1,n_find,
                                              &lookedup_donation,&n_lookedup,1);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0xb59,"ref_interp_from_part",(ulong)uVar7,"blind send cell");
                      return uVar7;
                    }
                    if (0 < n_lookedup) {
                      lVar12 = 0;
                      do {
                        donor_cell[lookedup_donation[lVar12]] = lookedup_cell[lVar12];
                        lVar12 = lVar12 + 1;
                      } while (lVar12 < n_lookedup);
                    }
                    local_19c = 0;
                    if (0 < ref_node->max) {
                      pRVar8 = ref_node->part;
                      do {
                        pRVar8[local_19c] = local_e8[local_19c];
                        local_19c = local_19c + 1;
                      } while (local_19c < ref_node->max);
                    }
                    uVar7 = ref_migrate_shufflin(local_b0);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0xb64,"ref_interp_from_part",(ulong)uVar7,"shufflin to grid");
                      return uVar7;
                    }
                    uVar7 = ref_interp_reset(ref_interp);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0xb67,"ref_interp_from_part",(ulong)uVar7,"ref_interp resize/reset");
                      return uVar7;
                    }
                    if (recept_part != (REF_INT *)0x0) {
                      free(recept_part);
                    }
                    if (recept_global != (REF_GLOB *)0x0) {
                      free(recept_global);
                    }
                    if (recept_cell != (REF_INT *)0x0) {
                      free(recept_cell);
                    }
                    if (recept_bary != (REF_DBL *)0x0) {
                      free(recept_bary);
                    }
                    uVar7 = ref_mpi_blindsend(local_190,donor_ret,donor_cell,1,n_donor,&recept_cell,
                                              &n_recept,1);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0xb70,"ref_interp_from_part",(ulong)uVar7,"blind send cell");
                      return uVar7;
                    }
                    uVar7 = ref_mpi_blindsend(local_190,donor_ret,donor_global,1,n_donor,
                                              &recept_global,&n_recept,2);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0xb73,"ref_interp_from_part",(ulong)uVar7,"blind send cell");
                      return uVar7;
                    }
                    uVar7 = ref_mpi_blindsend(local_190,donor_ret,local_160,1,n_donor,&recept_part,
                                              &n_recept,1);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0xb76,"ref_interp_from_part",(ulong)uVar7,"blind send cell");
                      return uVar7;
                    }
                    uVar7 = ref_mpi_blindsend(local_190,donor_ret,donor_bary,4,n_donor,&recept_bary,
                                              &n_recept,3);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0xb79,"ref_interp_from_part",(ulong)uVar7,"blind send cell");
                      return uVar7;
                    }
                    if (0 < n_recept) {
                      lVar16 = 0;
                      lVar12 = 0;
                      do {
                        uVar7 = ref_node_local(ref_node,recept_global[lVar12],&local_19c);
                        if (uVar7 != 0) {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                                 ,0xb7c,"ref_interp_from_part",(ulong)uVar7,"g2l");
                          return uVar7;
                        }
                        ref_interp->cell[local_19c] = recept_cell[lVar12];
                        ref_interp->part[local_19c] = recept_part[lVar12];
                        pRVar9 = ref_interp->bary;
                        lVar19 = 0;
                        do {
                          pRVar9[(long)local_19c * 4 + lVar19] =
                               *(REF_DBL *)((long)recept_bary + lVar19 * 8 + lVar16);
                          lVar19 = lVar19 + 1;
                        } while (lVar19 != 4);
                        lVar12 = lVar12 + 1;
                        lVar16 = lVar16 + 0x20;
                      } while (lVar12 < n_recept);
                    }
                    uVar7 = ref_search_free(ref_interp->ref_search);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                             ,0xb85,"ref_interp_from_part",(ulong)uVar7,"free search tree");
                      return uVar7;
                    }
                    uVar7 = ref_interp_create_search(ref_interp);
                    if (uVar7 == 0) {
                      if (lookedup_donation != (REF_INT *)0x0) {
                        free(lookedup_donation);
                      }
                      if (lookedup_cell != (REF_INT *)0x0) {
                        free(lookedup_cell);
                      }
                      free(local_118);
                      if (find_ret != (REF_INT *)0x0) {
                        free(find_ret);
                      }
                      if (find_donation != (REF_INT *)0x0) {
                        free(find_donation);
                      }
                      if (find_nodes != (REF_GLOB *)0x0) {
                        free(find_nodes);
                      }
                      free(local_110);
                      free(local_160);
                      free(local_108);
                      if (local_170 != (REF_INT *)0x0) {
                        free(local_170);
                      }
                      if (donor_bary != (REF_DBL *)0x0) {
                        free(donor_bary);
                      }
                      if (donor_global != (REF_GLOB *)0x0) {
                        free(donor_global);
                      }
                      if (donor_ret != (REF_INT *)0x0) {
                        free(donor_ret);
                      }
                      if (donor_cell != (REF_INT *)0x0) {
                        free(donor_cell);
                      }
                      if (recept_part != (REF_INT *)0x0) {
                        free(recept_part);
                      }
                      free(local_100);
                      if (recept_global != (REF_GLOB *)0x0) {
                        free(recept_global);
                      }
                      if (recept_cell != (REF_INT *)0x0) {
                        free(recept_cell);
                      }
                      if (recept_bary != (REF_DBL *)0x0) {
                        free(recept_bary);
                      }
                      if (local_178 != (REF_INT *)0x0) {
                        free(local_178);
                      }
                      return 0;
                    }
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0xb86,"ref_interp_from_part",(ulong)uVar7,"(re)build search tree");
                    return uVar7;
                  }
                  pcVar17 = "malloc find_cell of REF_INT NULL";
                  uVar14 = 0xb48;
                  local_118 = (void *)0x0;
                }
              }
            }
          }
        }
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar14,
         "ref_interp_from_part",pcVar17);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_interp_from_part(REF_INTERP ref_interp,
                                        REF_INT *to_part) {
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_cell;
  REF_INT node, i, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT *from_part;
  REF_INT recept, n_recept, donation, n_donor;
  REF_INT find, n_find, lookedup, n_lookedup;
  REF_INT *donor_ret, *donor_cell, *donor_donation, *donor_part,
      *donor_origpart;
  REF_INT *recept_part, *recept_ret, *recept_cell;
  REF_GLOB *recept_global, *donor_global, *donor_nodes;
  REF_DBL *recept_bary, *donor_bary;
  REF_INT *find_ret, *find_donation, *find_cell;
  REF_GLOB *find_nodes;
  REF_INT *lookedup_donation, *lookedup_cell;
  REF_DBL max_error = -1.0;
  REF_BOOL report_migration_volume = REF_FALSE;
  REF_BOOL report_interp_error = REF_FALSE;

  if (ref_grid_twod(from_grid)) {
    from_cell = ref_interp_from_tri(ref_interp);
  } else {
    from_cell = ref_interp_from_tet(ref_interp);
  }

  if (report_interp_error) {
    RSS(ref_interp_max_error(ref_interp, &max_error), "max error");
    if (ref_mpi_once(ref_grid_mpi(to_grid))) {
      printf("starting %e max error\n", max_error);
    }
  }

  if (ref_node_max(to_node) > ref_interp_max(ref_interp)) {
    RSS(ref_interp_resize(ref_interp, ref_node_max(to_node)), "resize");
  }

  ref_malloc_init(from_part, ref_node_max(from_node), REF_INT, REF_EMPTY);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      n_recept++;
    }
  }

  ref_malloc(recept_bary, 4 * n_recept, REF_DBL);
  ref_malloc(recept_cell, n_recept, REF_INT);
  ref_malloc(recept_global, n_recept, REF_GLOB);
  ref_malloc(recept_ret, n_recept, REF_INT);
  ref_malloc(recept_part, n_recept, REF_INT);

  n_recept = 0;
  each_ref_node_valid_node(to_node, node) {
    if (ref_node_owned(to_node, node) && REF_EMPTY != ref_interp->cell[node]) {
      for (i = 0; i < 4; i++) {
        recept_bary[i + 4 * n_recept] = ref_interp->bary[i + 4 * node];
      }
      recept_cell[n_recept] = ref_interp->cell[node];
      recept_global[n_recept] = ref_node_global(to_node, node);
      recept_part[n_recept] = ref_interp->part[node];
      recept_ret[n_recept] = to_part[node];
      n_recept++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, recept_part, (void *)recept_cell, 1, n_recept,
                        (void **)(&donor_cell), &n_donor, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, recept_part, (void *)recept_ret, 1, n_recept,
                        (void **)(&donor_ret), &n_donor, REF_INT_TYPE),
      "blind send ret");
  RSS(ref_mpi_blindsend(ref_mpi, recept_part, (void *)recept_global, 1,
                        n_recept, (void **)(&donor_global), &n_donor,
                        REF_GLOB_TYPE),
      "blind send global");
  RSS(ref_mpi_blindsend(ref_mpi, recept_part, (void *)recept_bary, 4, n_recept,
                        (void **)(&donor_bary), &n_donor, REF_DBL_TYPE),
      "blind send bary");

  ref_malloc_init(donor_nodes, 4 * n_donor, REF_GLOB, REF_EMPTY);
  ref_malloc(donor_donation, n_donor, REF_INT);
  ref_malloc(donor_part, n_donor, REF_INT);
  ref_malloc(donor_origpart, n_donor, REF_INT);

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (i = 0; i < ref_cell_node_per(from_cell); i++) {
      from_part[nodes[i]] = donor_ret[donation];
    }
  }
  RSS(ref_node_ghost_int(from_node, from_part, 1), "ghost from_part");
  if (report_migration_volume)
    RSS(ref_interp_from_part_status(ref_interp, from_part), "from part status");
  RSS(ref_interp_fill_empty_from_part(ref_interp, from_part), "fill part");
  if (report_migration_volume)
    RSS(ref_interp_from_part_status(ref_interp, from_part), "from part status");

  for (donation = 0; donation < n_donor; donation++) {
    RSS(ref_cell_nodes(from_cell, donor_cell[donation], nodes),
        "node needs to be localized");
    for (i = 0; i < ref_cell_node_per(from_cell); i++) {
      donor_nodes[i + 4 * donation] = ref_node_global(from_node, nodes[i]);
    }
    donor_donation[donation] = donation;
    RSS(ref_cell_part_cell_node(from_cell, from_node, donor_cell[donation],
                                &cell_node),
        "part cell_node");
    donor_part[donation] = from_part[nodes[cell_node]];
    donor_origpart[donation] = ref_mpi_rank(ref_mpi);
  }

  /* ensure parts of from_node are set */
  each_ref_node_valid_node(from_node, node) {
    RUS(REF_EMPTY, from_part[node], "from_part not set for node");
  }

  /* set parts of from_node */
  for (node = 0; node < ref_node_max(from_node); node++)
    ref_node_part(from_node, node) = from_part[node];

  /* shuffle from_node */
  RSS(ref_migrate_shufflin(from_grid), "shufflin from grid");

  if (ref_interp_from_cell_freeable(ref_interp)) {
    ref_cell_free(ref_interp_from_tri(ref_interp));
    ref_cell_free(ref_interp_from_tet(ref_interp));
    RSS(ref_shard_extract_tri(from_grid, &ref_interp_from_tri(ref_interp)),
        "shard tri");
    RSS(ref_shard_extract_tet(from_grid, &ref_interp_from_tet(ref_interp)),
        "shard tet");
    if (ref_grid_twod(from_grid)) {
      from_cell = ref_interp_from_tri(ref_interp);
    } else {
      from_cell = ref_interp_from_tet(ref_interp);
    }
  }

  /* use new from part to translate nodes to cell (back and forth) */

  RSS(ref_mpi_blindsend(ref_mpi, donor_part, (void *)donor_nodes, 4, n_donor,
                        (void **)(&find_nodes), &n_find, REF_GLOB_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_part, (void *)donor_donation, 1, n_donor,
                        (void **)(&find_donation), &n_find, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_part, (void *)donor_origpart, 1, n_donor,
                        (void **)(&find_ret), &n_find, REF_INT_TYPE),
      "blind send cell");

  ref_malloc(find_cell, n_find, REF_INT);

  for (find = 0; find < n_find; find++) {
    for (i = 0; i < ref_cell_node_per(from_cell); i++) {
      RSS(ref_node_local(from_node, find_nodes[i + 4 * find], &(nodes[i])),
          "g2l");
    }
    RSS(ref_cell_with(from_cell, nodes, &(find_cell[find])),
        "find cell with nodes");
  }

  RSS(ref_mpi_blindsend(ref_mpi, find_ret, (void *)find_cell, 1, n_find,
                        (void **)(&lookedup_cell), &n_lookedup, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, find_ret, (void *)find_donation, 1, n_find,
                        (void **)(&lookedup_donation), &n_lookedup,
                        REF_INT_TYPE),
      "blind send cell");

  for (lookedup = 0; lookedup < n_lookedup; lookedup++) {
    donor_cell[lookedup_donation[lookedup]] = lookedup_cell[lookedup];
  }

  /* shuffle to */
  for (node = 0; node < ref_node_max(to_node); node++) {
    ref_node_part(to_node, node) = to_part[node];
  }

  RSS(ref_migrate_shufflin(to_grid), "shufflin to grid");

  /* return from data to to grid and refill ref_interp->data */
  RSS(ref_interp_reset(ref_interp), "ref_interp resize/reset");

  ref_free(recept_part);
  ref_free(recept_global);
  ref_free(recept_cell);
  ref_free(recept_bary);

  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_cell, 1, n_donor,
                        (void **)(&recept_cell), &n_recept, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_global, 1, n_donor,
                        (void **)(&recept_global), &n_recept, REF_GLOB_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_part, 1, n_donor,
                        (void **)(&recept_part), &n_recept, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, donor_ret, (void *)donor_bary, 4, n_donor,
                        (void **)(&recept_bary), &n_recept, REF_DBL_TYPE),
      "blind send cell");

  for (recept = 0; recept < n_recept; recept++) {
    RSS(ref_node_local(to_node, recept_global[recept], &node), "g2l");
    ref_interp->cell[node] = recept_cell[recept];
    ref_interp->part[node] = recept_part[recept];
    for (i = 0; i < 4; i++) {
      ref_interp->bary[i + 4 * node] = recept_bary[i + 4 * recept];
    }
  }

  /* remake interp search tree */
  RSS(ref_search_free(ref_interp_search(ref_interp)), "free search tree");
  RSS(ref_interp_create_search(ref_interp), "(re)build search tree");

  ref_free(lookedup_donation);
  ref_free(lookedup_cell);

  ref_free(find_cell);
  ref_free(find_ret);
  ref_free(find_donation);
  ref_free(find_nodes);

  ref_free(donor_origpart);
  ref_free(donor_part);
  ref_free(donor_donation);
  ref_free(donor_nodes);
  ref_free(donor_bary);
  ref_free(donor_global);
  ref_free(donor_ret);
  ref_free(donor_cell);

  ref_free(recept_part);
  ref_free(recept_ret);
  ref_free(recept_global);
  ref_free(recept_cell);
  ref_free(recept_bary);

  ref_free(from_part);

  if (report_interp_error) {
    RSS(ref_interp_max_error(ref_interp, &max_error), "max error");
    if (ref_mpi_once(ref_grid_mpi(to_grid))) {
      printf("final %e max error\n", max_error);
    }
  }

  return REF_SUCCESS;
}